

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_free(t_bonk *x)

{
  int iVar1;
  t_insig *local_20;
  t_insig *gp;
  int ninsig;
  int i;
  t_bonk *x_local;
  
  iVar1 = x->x_ninsig;
  gp._4_4_ = 0;
  local_20 = x->x_insig;
  for (; gp._4_4_ < iVar1; gp._4_4_ = gp._4_4_ + 1) {
    freebytes(local_20->g_inbuf,(long)x->x_npoints << 2);
    local_20 = local_20 + 1;
  }
  freebytes(x->x_insig,(long)iVar1 * 0x2598);
  clock_free(x->x_clock);
  iVar1 = x->x_filterbank->b_refcount + -1;
  x->x_filterbank->b_refcount = iVar1;
  if (iVar1 == 0) {
    bonk_freefilterbank(x->x_filterbank);
  }
  freebytes(x->x_template,(long)x->x_ntemplate * 800);
  return;
}

Assistant:

static void bonk_free(t_bonk *x)
{
    
    int i, ninsig = x->x_ninsig;
    t_insig *gp = x->x_insig;
#ifdef MSP
    dsp_free((t_pxobject *)x);
#endif
    for (i = 0, gp = x->x_insig; i < ninsig; i++, gp++)
        freebytes(gp->g_inbuf, x->x_npoints * sizeof(t_float));
    freebytes(x->x_insig, ninsig * sizeof(*x->x_insig));
    clock_free(x->x_clock);
    if (!--(x->x_filterbank->b_refcount))
        bonk_freefilterbank(x->x_filterbank);
    freebytes(x->x_template, x->x_ntemplate * sizeof(x->x_template[0]));
}